

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementBeamANCF_3333::GetVonMissesStress
          (ChElementBeamANCF_3333 *this,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  double *pdVar14;
  Index row;
  ActualDstType actualDst;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar30;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_6,_6> D;
  Matrix3xN e_bar;
  ChMatrixNM<double,_3,_3> SPK2;
  MatrixNx3c Sxi_D;
  ChMatrix33<double> S;
  ChMatrix33<double> J_0xi;
  double local_520;
  double dStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_4f0;
  double local_4a0 [6];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  ChMatrixNM<double,_6,_6> local_440;
  undefined1 local_318 [32];
  ulong auStack_2f8 [6];
  MatrixNx3c *local_2c8;
  Matrix<double,_3,_3,_1,_3,_3> *local_2c0;
  double local_2b8;
  Matrix<double,_3,_3,_0,_3,_3> local_240;
  Matrix<double,_3,_3,_0,_3,_3> *local_1f0;
  Matrix<double,_3,_3,_0,_3,_3> *local_1e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1e0;
  double local_1d0;
  MatrixNx3c local_1c0;
  ChMatrix33<double> local_e0;
  Matrix<double,_3,_3,_1,_3,_3> local_98;
  
  Calc_Sxi_D(this,&local_1c0,xi,eta,zeta);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_98,&this->m_ebar0,&local_1c0);
  local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_1c0;
  local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_98;
  local_318._0_8_ = &local_1c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_318 + 8),
        (SrcXprType *)
        (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)&local_440);
  local_2c8 = (MatrixNx3c *)local_318._0_8_;
  local_2c0 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_318 + 8);
  local_2b8 = 1.48219693752374e-323;
  auVar18 = *(undefined1 (*) [16])
             (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array;
  auVar19 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->
              m_storage).m_data.array + 2);
  auVar20 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->
              m_storage).m_data.array + 4);
  auVar21 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->
              m_storage).m_data.array + 6);
  auVar48 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->
              m_storage).m_data.array + 9);
  auVar49 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->
              m_storage).m_data.array + 0x12);
  auVar1 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0xb);
  auVar2 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0x14);
  auVar3 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0xd);
  auVar4 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0x16);
  auVar5 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0xf);
  auVar6 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage
             ).m_data.array + 0x18);
  dVar22 = (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage).
           m_data.array[8];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage).
       m_data.array[0x11];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_318._0_8_)->m_storage).
       m_data.array[0x1a];
  lVar13 = 7;
  pdVar14 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 8;
  do {
    dVar30 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
             .array[lVar13 + 0x1f];
    auVar54._8_8_ = dVar30;
    auVar54._0_8_ = dVar30;
    auVar15 = vmulpd_avx512vl(auVar18,auVar54);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[lVar13 + 0x22];
    auVar16 = vmovddup_avx512vl(auVar16);
    auVar17 = vfmadd231pd_avx512vl(auVar15,auVar48,auVar16);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auStack_2f8[lVar13 + -4];
    auVar15 = vmovddup_avx512vl(auVar15);
    auVar17 = vfmadd231pd_avx512vl(auVar17,auVar49,auVar15);
    *(undefined1 (*) [16])((plain_array<double,_36,_1,_32> *)(pdVar14 + -8))->array = auVar17;
    auVar17 = vmulpd_avx512vl(auVar19,auVar54);
    auVar17 = vfmadd231pd_avx512vl(auVar17,auVar1,auVar16);
    auVar17 = vfmadd231pd_avx512vl(auVar17,auVar2,auVar15);
    *(undefined1 (*) [16])(pdVar14 + -6) = auVar17;
    auVar17 = vmulpd_avx512vl(auVar20,auVar54);
    auVar17 = vfmadd231pd_avx512vl(auVar17,auVar3,auVar16);
    auVar17 = vfmadd231pd_avx512vl(auVar17,auVar4,auVar15);
    *(undefined1 (*) [16])(pdVar14 + -4) = auVar17;
    auVar17 = vmulpd_avx512vl(auVar21,auVar54);
    auVar16 = vfmadd231pd_avx512vl(auVar17,auVar5,auVar16);
    auVar16 = vfmadd231pd_avx512vl(auVar16,auVar6,auVar15);
    *(undefined1 (*) [16])(pdVar14 + -2) = auVar16;
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[lVar13 + 0x22];
    auVar16 = vmulsd_avx512f(auVar50,auVar17);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auStack_2f8[lVar13 + -4];
    auVar15 = vmulsd_avx512f(auVar52,auVar7);
    auVar16 = vaddsd_avx512f(auVar16,auVar15);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar22 * dVar30;
    auVar16 = vaddsd_avx512f(auVar55,auVar16);
    *pdVar14 = auVar16._0_8_;
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 9;
  } while (lVar13 != 10);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[1] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [1];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[2] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [2];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[3] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [3];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[4] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [4];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[5] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [5];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[6] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [6];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[7] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [7];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[8] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [8];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[9] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [9];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[10]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[10];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xb]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xb];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xc]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xc];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xd]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xd];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xe]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xe];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xf]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xf];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x10] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x10];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x11] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x11];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x12] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x12];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x13] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x13];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x14] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x14];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x15] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x15];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x16] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x16];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x17] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x17];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x18] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x18];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x19] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x19];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x1a] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x1a];
  CalcCoordMatrix(this,(Matrix3xN *)local_318);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>(&local_4f0,(Matrix3xN *)local_318,&local_1c0);
  dVar8 = (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] + -1.0) * 0.5;
  dVar22 = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar30 = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar30;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] +
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar22;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar8;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] +
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_470 = auVar49;
    local_460 = auVar21;
    local_450 = auVar19;
    CalcCoordDerivMatrix(this,(Matrix3xN *)&local_440);
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_240,(Matrix<double,_3,_9,_1,_3,_9> *)&local_440,&local_1c0);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = this->m_Alpha;
    auVar9._8_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
    auVar9._0_8_ = local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
    auVar12._8_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar12._0_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar18 = vmulpd_avx512vl(auVar9,auVar12);
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar19 = vmulsd_avx512f(auVar43,auVar57);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_470._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auVar18._0_8_ + auVar18._8_8_ + auVar19._0_8_;
    auVar18 = vfmadd213sd_fma(auVar39,auVar23,auVar1);
    auVar10._8_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar10._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar8;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar19 = vfmadd213sd_fma(auVar46,auVar23,auVar2);
    auVar11._8_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar11._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar51._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar51._8_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar20 = vmulsd_avx512f(auVar53,auVar56);
    auVar20 = vaddsd_avx512f(auVar51,auVar20);
    auVar34._0_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._8_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar21 = vmulsd_avx512f(auVar47,auVar56);
    auVar21 = vaddsd_avx512f(auVar34,auVar21);
    local_500 = vunpcklpd_avx(auVar18,auVar19);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_460._0_8_;
    auVar18 = vfmadd213sd_fma(auVar20,auVar23,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar22;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar21._0_8_;
    auVar19 = vfmadd213sd_fma(auVar35,auVar23,auVar4);
    local_510 = vunpcklpd_avx(auVar18,auVar19);
    auVar18 = vmulpd_avx512vl(auVar12,auVar11);
    auVar19 = vmulsd_avx512f(auVar57,auVar53);
    auVar20 = vmulpd_avx512vl(auVar12,auVar10);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_450._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         auVar18._0_8_ + auVar18._8_8_ + auVar19._0_8_ +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar18 = vfmadd213sd_fma(auVar36,auVar23,auVar5);
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar19 = vmulsd_avx512f(auVar58,auVar47);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar30;
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         auVar20._0_8_ + auVar20._8_8_ + auVar19._0_8_ +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar19 = vfmadd213sd_fma(auVar31,auVar23,auVar6);
    auVar18 = vunpcklpd_avx(auVar18,auVar19);
  }
  else {
    local_500 = vunpcklpd_avx(auVar49,auVar48);
    local_510 = vunpcklpd_avx(auVar21,auVar20);
    auVar18 = vunpcklpd_avx(auVar19,auVar18);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,&local_440);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar14 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 4;
  lVar13 = 0;
  local_520 = auVar18._0_8_;
  dStack_518 = auVar18._8_8_;
  do {
    dVar22 = (double)local_500._0_8_ * ((plain_array<double,_36,_1,_32> *)(pdVar14 + -4))->array[0]
             + (double)local_510._0_8_ * pdVar14[-2] + local_520 * *pdVar14;
    dVar30 = (double)local_500._8_8_ * pdVar14[-3] +
             (double)local_510._8_8_ * pdVar14[-1] + dStack_518 * pdVar14[1];
    auVar24._0_8_ = dVar22 + dVar30;
    auVar24._8_8_ = dVar22 + dVar30;
    dVar22 = (double)vmovlpd_avx(auVar24);
    local_4a0[lVar13] = dVar22;
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 6;
  } while (lVar13 != 6);
  local_1e8 = &local_240;
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_4a0[0];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_4a0[1];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_4a0[2];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_4a0[3];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_4a0[3];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_4a0[4];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_4a0[4];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_4a0[5];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_4a0[5];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar18 = vfmsub231sd_fma(auVar44,auVar25,auVar32);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar19 = vfmsub231sd_fma(auVar37,auVar45,auVar32);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar20 = vfmsub231sd_fma(auVar26,auVar45,auVar40);
  local_1d0 = auVar20._0_8_ *
              local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] +
              (auVar18._0_8_ *
               local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] -
              auVar19._0_8_ *
              local_4f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3]);
  local_1f0 = &local_4f0;
  local_1e0 = &local_4f0;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_e0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_1f0);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar18 = vfmadd231sd_fma(auVar27,auVar41,auVar41);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar18 = vfmadd213sd_fma(auVar33,auVar33,auVar18);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar19 = vfmadd231sd_fma(auVar42,auVar28,auVar28);
  auVar19 = vfmadd231sd_fma(auVar19,auVar38,auVar38);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar19._0_8_ * 3.0;
  auVar18 = vfmadd231sd_fma(auVar29,auVar18,ZEXT816(0x3fe0000000000000));
  if (auVar18._0_8_ < 0.0) {
    dVar22 = sqrt(auVar18._0_8_);
  }
  else {
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    dVar22 = auVar18._0_8_;
  }
  return dVar22;
}

Assistant:

double ChElementBeamANCF_3333::GetVonMissesStress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}